

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O3

void CreateIntegerTable(Connection *con,int64_t count)

{
  bool bVar1;
  AssertionHandler catchAssertionHandler;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_b0;
  StringRef local_a8;
  char local_98 [16];
  SourceLineInfo local_88;
  AssertionHandler local_78;
  StringRef local_30;
  
  local_a8.m_start = "REQUIRE";
  local_a8.m_size = 7;
  local_88.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/sql/parallelism/interquery/test_concurrent_index.cpp"
  ;
  local_88.line = 0x14;
  Catch::StringRef::StringRef
            (&local_30,
             "NO_FAIL((con->Query(\"CREATE TABLE integers AS SELECT range AS i FROM range ($1)\", count)))"
            );
  Catch::AssertionHandler::AssertionHandler(&local_78,&local_a8,&local_88,local_30,Normal);
  local_a8.m_start = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"CREATE TABLE integers AS SELECT range AS i FROM range ($1)","");
  duckdb::Connection::Query<long>((Connection *)&local_b0,(string *)con,(long)&local_a8);
  bVar1 = duckdb::NO_FAIL((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)&local_b0);
  local_88.file = (char *)CONCAT71(local_88.file._1_7_,bVar1);
  Catch::AssertionHandler::handleExpr<bool>(&local_78,(ExprLhs<bool> *)&local_88);
  if (local_b0._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_b0._M_head_impl + 8))();
  }
  local_b0._M_head_impl = (QueryResult *)0x0;
  if (local_a8.m_start != local_98) {
    operator_delete(local_a8.m_start);
  }
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  return;
}

Assistant:

static void CreateIntegerTable(Connection *con, int64_t count) {
	REQUIRE_NO_FAIL(con->Query("CREATE TABLE integers AS SELECT range AS i FROM range ($1)", count));
}